

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O3

void __thiscall
tf::
Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:751:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:763:40)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:774:38)>_>
::_on_pipe(Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
           *this,Pipeflow *pf,Runtime *rt)

{
  size_t sVar1;
  atomic<unsigned_long> *paVar2;
  pthread_mutex_t *__mutex;
  pointer paVar3;
  vector<int,std::allocator<int>> *this_00;
  iterator __position;
  size_t *psVar4;
  code *pcVar5;
  char extraout_AL;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  char extraout_AL_04;
  bool bVar6;
  char extraout_AL_05;
  int iVar7;
  int *__args;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double dVar8;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double extraout_XMM0_Qa_11;
  double extraout_XMM0_Qa_12;
  ResultBuilder DOCTEST_RB;
  Result local_d8;
  ResultBuilder local_b8;
  Expression_lhs<const_unsigned_long_&> local_40;
  size_t local_30;
  
  sVar1 = pf->_pipe;
  if (sVar1 == 2) {
    local_b8.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_b8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_b8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_b8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_b8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_b8.super_AssertData.m_at = DT_REQUIRE;
    local_b8.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp"
    ;
    local_b8.super_AssertData.m_line = 0x307;
    local_b8.super_AssertData.m_expr = "j3 < N";
    local_b8.super_AssertData.m_failed = true;
    local_b8.super_AssertData.m_threw = false;
    local_b8.super_AssertData.m_threw_as = false;
    local_b8.super_AssertData.m_exception_type = "";
    local_b8.super_AssertData.m_exception_string = "";
    local_40.lhs = *(size_t **)
                    ((long)&(this->_pipes).
                            super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                            .
                            super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                            .
                            super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                            .
                            super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>,_false>
                            ._M_head_impl._callable + 0x10);
    local_40.m_at = DT_REQUIRE;
    doctest::detail::Expression_lhs<const_unsigned_long_&>::operator<<unsigned_long,_nullptr>
              (&local_d8,&local_40,
               &(this->_pipes).
                super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                .
                super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                .
                super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                .
                super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>,_false>
                ._M_head_impl._callable.N);
    doctest::String::operator=(&local_b8.super_AssertData.m_decomp,&local_d8.m_decomp);
    local_b8.super_AssertData._40_2_ =
         CONCAT11(local_b8.super_AssertData.m_threw,local_d8.m_passed) ^ 1;
    dVar8 = extraout_XMM0_Qa_03;
    if ((local_d8.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_d8.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_d8.m_decomp.field_0.data.ptr);
      dVar8 = extraout_XMM0_Qa_04;
    }
    doctest::detail::ResultBuilder::log(&local_b8,dVar8);
    if (extraout_AL_01 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    if (local_b8.super_AssertData.m_failed == true) {
      bVar6 = doctest::detail::checkIfShouldThrow(local_b8.super_AssertData.m_at);
      if (bVar6) {
        doctest::detail::throwException();
      }
    }
    if ((local_b8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                         local_b8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                                         local_b8.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_b8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                         local_b8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                                         local_b8.super_AssertData.m_exception.field_0.buf[0]));
    }
    local_b8.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_b8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_b8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_b8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_b8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_b8.super_AssertData.m_at = DT_REQUIRE;
    local_b8.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp"
    ;
    local_b8.super_AssertData.m_line = 0x308;
    local_b8.super_AssertData.m_expr = "pf.token() % L == pf.line()";
    local_b8.super_AssertData.m_failed = true;
    local_b8.super_AssertData.m_threw = false;
    local_b8.super_AssertData.m_threw_as = false;
    local_b8.super_AssertData.m_exception_type = "";
    local_b8.super_AssertData.m_exception_string = "";
    local_40.lhs = (unsigned_long *)
                   (pf->_token %
                   *(size_t *)
                    ((long)&(this->_pipes).
                            super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                            .
                            super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                            .
                            super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                            .
                            super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>,_false>
                            ._M_head_impl._callable + 0x20));
    local_40.m_at = DT_REQUIRE;
    local_30 = pf->_line;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              (&local_d8,(Expression_lhs<unsigned_long_const> *)&local_40,&local_30);
    doctest::String::operator=(&local_b8.super_AssertData.m_decomp,&local_d8.m_decomp);
    local_b8.super_AssertData._40_2_ =
         CONCAT11(local_b8.super_AssertData.m_threw,local_d8.m_passed) ^ 1;
    dVar8 = extraout_XMM0_Qa_05;
    if ((local_d8.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_d8.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_d8.m_decomp.field_0.data.ptr);
      dVar8 = extraout_XMM0_Qa_06;
    }
    doctest::detail::ResultBuilder::log(&local_b8,dVar8);
    if (extraout_AL_02 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    if (local_b8.super_AssertData.m_failed == true) {
      bVar6 = doctest::detail::checkIfShouldThrow(local_b8.super_AssertData.m_at);
      if (bVar6) {
        doctest::detail::throwException();
      }
    }
    if ((local_b8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                         local_b8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                                         local_b8.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_b8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                         local_b8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                                         local_b8.super_AssertData.m_exception.field_0.buf[0]));
    }
    local_b8.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_b8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_b8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_b8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_b8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_b8.super_AssertData.m_at = DT_REQUIRE;
    local_b8.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp"
    ;
    local_b8.super_AssertData.m_line = 0x309;
    local_b8.super_AssertData.m_expr = "source[j3] + 2 == mybuffer[pf.line()][pf.pipe() - 1]";
    local_b8.super_AssertData.m_failed = true;
    local_b8.super_AssertData.m_threw = false;
    local_b8.super_AssertData.m_threw_as = false;
    local_b8.super_AssertData.m_exception_type = "";
    local_b8.super_AssertData.m_exception_string = "";
    local_40.lhs = (unsigned_long *)
                   ((ulong)(((*(vector<int,_std::allocator<int>_> **)
                               ((long)&(this->_pipes).
                                       super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                                       .
                                       super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                                       .
                                       super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                                       .
                                       super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>,_false>
                                       ._M_head_impl._callable + 8))->
                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start
                            [**(size_t **)
                               ((long)&(this->_pipes).
                                       super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                                       .
                                       super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                                       .
                                       super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                                       .
                                       super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>,_false>
                                       ._M_head_impl._callable + 0x10)] + 2) | 0xc00000000);
    doctest::detail::Expression_lhs<const_int>::operator==<int,_nullptr>
              (&local_d8,(Expression_lhs<const_int> *)&local_40,
               ((*(vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> **)
                  ((long)&(this->_pipes).
                          super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                          .
                          super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                          .
                          super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                          .
                          super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>,_false>
                          ._M_head_impl._callable + 0x18))->
               super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>).
               _M_impl.super__Vector_impl_data._M_start[pf->_line]._M_elems + (pf->_pipe - 1));
    doctest::String::operator=(&local_b8.super_AssertData.m_decomp,&local_d8.m_decomp);
    local_b8.super_AssertData._40_2_ =
         CONCAT11(local_b8.super_AssertData.m_threw,local_d8.m_passed) ^ 1;
    dVar8 = extraout_XMM0_Qa_07;
    if ((local_d8.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_d8.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_d8.m_decomp.field_0.data.ptr);
      dVar8 = extraout_XMM0_Qa_08;
    }
    doctest::detail::ResultBuilder::log(&local_b8,dVar8);
    if (extraout_AL_03 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    if (local_b8.super_AssertData.m_failed == true) {
      bVar6 = doctest::detail::checkIfShouldThrow(local_b8.super_AssertData.m_at);
      if (bVar6) {
        doctest::detail::throwException();
      }
    }
    if ((local_b8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                         local_b8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                                         local_b8.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_b8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                         local_b8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                                         local_b8.super_AssertData.m_exception.field_0.buf[0]));
    }
    psVar4 = *(size_t **)
              ((long)&(this->_pipes).
                      super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                      .
                      super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                      .
                      super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                      .
                      super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>,_false>
                      ._M_head_impl._callable + 0x10);
    *psVar4 = *psVar4 + 1;
  }
  else if (sVar1 == 1) {
    local_b8.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_b8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_b8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_b8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_b8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_b8.super_AssertData.m_at = DT_REQUIRE;
    local_b8.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp"
    ;
    local_b8.super_AssertData.m_line = 0x2fc;
    local_b8.super_AssertData.m_expr = "j2++ < N";
    local_b8.super_AssertData.m_failed = true;
    local_b8.super_AssertData.m_threw = false;
    local_b8.super_AssertData.m_threw_as = false;
    local_b8.super_AssertData.m_exception_type = "";
    local_b8.super_AssertData.m_exception_string = "";
    paVar2 = (this->_pipes).
             super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
             .
             super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
             .
             super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_false>
             ._M_head_impl._callable.j2;
    LOCK();
    local_40.lhs = (unsigned_long *)(paVar2->super___atomic_base<unsigned_long>)._M_i;
    (paVar2->super___atomic_base<unsigned_long>)._M_i =
         (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    local_40.m_at = DT_REQUIRE;
    doctest::detail::Expression_lhs<const_unsigned_long>::operator<<unsigned_long,_nullptr>
              (&local_d8,(Expression_lhs<const_unsigned_long> *)&local_40,
               &(this->_pipes).
                super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                .
                super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                .
                super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_false>
                ._M_head_impl._callable.N);
    doctest::String::operator=(&local_b8.super_AssertData.m_decomp,&local_d8.m_decomp);
    local_b8.super_AssertData._40_2_ =
         CONCAT11(local_b8.super_AssertData.m_threw,local_d8.m_passed) ^ 1;
    dVar8 = extraout_XMM0_Qa;
    if ((local_d8.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_d8.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_d8.m_decomp.field_0.data.ptr);
      dVar8 = extraout_XMM0_Qa_00;
    }
    doctest::detail::ResultBuilder::log(&local_b8,dVar8);
    if (extraout_AL != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    if (local_b8.super_AssertData.m_failed == true) {
      bVar6 = doctest::detail::checkIfShouldThrow(local_b8.super_AssertData.m_at);
      if (bVar6) {
        doctest::detail::throwException();
      }
    }
    if ((local_b8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                         local_b8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                                         local_b8.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_b8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                         local_b8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                                         local_b8.super_AssertData.m_exception.field_0.buf[0]));
    }
    __mutex = (pthread_mutex_t *)
              (this->_pipes).
              super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
              .
              super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
              .
              super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_false>
              ._M_head_impl._callable.mutex;
    iVar7 = pthread_mutex_lock(__mutex);
    if (iVar7 != 0) {
      std::__throw_system_error(iVar7);
    }
    local_30 = pf->_line;
    paVar3 = (((this->_pipes).
               super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
               .
               super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
               .
               super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_false>
               ._M_head_impl._callable.mybuffer)->
             super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    paVar3[local_30]._M_elems[pf->_pipe] = paVar3[local_30]._M_elems[pf->_pipe - 1] + 1;
    local_b8.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_b8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_b8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_b8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_b8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_b8.super_AssertData.m_at = DT_REQUIRE;
    local_b8.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp"
    ;
    local_b8.super_AssertData.m_line = 0x301;
    local_b8.super_AssertData.m_expr = "pf.token() % L == pf.line()";
    local_b8.super_AssertData.m_failed = true;
    local_b8.super_AssertData.m_threw = false;
    local_b8.super_AssertData.m_threw_as = false;
    local_b8.super_AssertData.m_exception_type = "";
    local_b8.super_AssertData.m_exception_string = "";
    local_40.lhs = (unsigned_long *)
                   (pf->_token %
                   (this->_pipes).
                   super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                   .
                   super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                   .
                   super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_false>
                   ._M_head_impl._callable.L);
    local_40.m_at = DT_REQUIRE;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              (&local_d8,(Expression_lhs<unsigned_long_const> *)&local_40,&local_30);
    doctest::String::operator=(&local_b8.super_AssertData.m_decomp,&local_d8.m_decomp);
    local_b8.super_AssertData._40_2_ =
         CONCAT11(local_b8.super_AssertData.m_threw,local_d8.m_passed) ^ 1;
    dVar8 = extraout_XMM0_Qa_01;
    if ((local_d8.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_d8.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_d8.m_decomp.field_0.data.ptr);
      dVar8 = extraout_XMM0_Qa_02;
    }
    doctest::detail::ResultBuilder::log(&local_b8,dVar8);
    if (extraout_AL_00 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    if (local_b8.super_AssertData.m_failed == true) {
      bVar6 = doctest::detail::checkIfShouldThrow(local_b8.super_AssertData.m_at);
      if (bVar6) {
        doctest::detail::throwException();
      }
    }
    if ((local_b8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                         local_b8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                                         local_b8.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_b8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                         local_b8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                                         local_b8.super_AssertData.m_exception.field_0.buf[0]));
    }
    this_00 = (vector<int,std::allocator<int>> *)
              (this->_pipes).
              super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
              .
              super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
              .
              super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_false>
              ._M_head_impl._callable.collection;
    __args = (((this->_pipes).
               super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
               .
               super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
               .
               super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_false>
               ._M_head_impl._callable.mybuffer)->
             super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>).
             _M_impl.super__Vector_impl_data._M_start[pf->_line]._M_elems + (pf->_pipe - 1);
    __position._M_current = *(int **)(this_00 + 8);
    if (__position._M_current == *(int **)(this_00 + 0x10)) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(this_00,__position,__args)
      ;
    }
    else {
      *__position._M_current = *__args;
      *(int **)(this_00 + 8) = __position._M_current + 1;
    }
    pthread_mutex_unlock(__mutex);
  }
  else if (sVar1 == 0) {
    local_40.lhs = (this->_pipes).
                   super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                   .
                   super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_false>
                   ._M_head_impl._callable.j1;
    if (*local_40.lhs ==
        (this->_pipes).
        super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
        .
        super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_false>
        ._M_head_impl._callable.N) {
      pf->_stop = true;
    }
    else {
      local_b8.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_b8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_b8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_b8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_b8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_b8.super_AssertData.m_at = DT_REQUIRE;
      local_b8.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp"
      ;
      local_b8.super_AssertData.m_line = 0x2f4;
      local_b8.super_AssertData.m_expr = "j1 == source[j1]";
      local_b8.super_AssertData.m_failed = true;
      local_b8.super_AssertData.m_threw = false;
      local_b8.super_AssertData.m_threw_as = false;
      local_b8.super_AssertData.m_exception_type = "";
      local_b8.super_AssertData.m_exception_string = "";
      local_40.m_at = DT_REQUIRE;
      doctest::detail::Expression_lhs<const_unsigned_long_&>::operator==<int,_nullptr>
                (&local_d8,&local_40,
                 (((this->_pipes).
                   super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                   .
                   super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_false>
                   ._M_head_impl._callable.source)->super__Vector_base<int,_std::allocator<int>_>).
                 _M_impl.super__Vector_impl_data._M_start + *local_40.lhs);
      doctest::String::operator=(&local_b8.super_AssertData.m_decomp,&local_d8.m_decomp);
      local_b8.super_AssertData._40_2_ =
           CONCAT11(local_b8.super_AssertData.m_threw,local_d8.m_passed) ^ 1;
      dVar8 = extraout_XMM0_Qa_09;
      if ((local_d8.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_d8.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_d8.m_decomp.field_0.data.ptr);
        dVar8 = extraout_XMM0_Qa_10;
      }
      doctest::detail::ResultBuilder::log(&local_b8,dVar8);
      if (extraout_AL_04 != '\0') {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
      if (local_b8.super_AssertData.m_failed == true) {
        bVar6 = doctest::detail::checkIfShouldThrow(local_b8.super_AssertData.m_at);
        if (bVar6) {
          doctest::detail::throwException();
        }
      }
      if ((local_b8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                           local_b8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                                           local_b8.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_b8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                           local_b8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                                           local_b8.super_AssertData.m_exception.field_0.buf[0]));
      }
      local_b8.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_b8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_b8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_b8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_b8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_b8.super_AssertData.m_at = DT_REQUIRE;
      local_b8.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp"
      ;
      local_b8.super_AssertData.m_line = 0x2f5;
      local_b8.super_AssertData.m_expr = "pf.token() % L == pf.line()";
      local_b8.super_AssertData.m_failed = true;
      local_b8.super_AssertData.m_threw = false;
      local_b8.super_AssertData.m_threw_as = false;
      local_b8.super_AssertData.m_exception_type = "";
      local_b8.super_AssertData.m_exception_string = "";
      local_40.lhs = (unsigned_long *)
                     (pf->_token %
                     (this->_pipes).
                     super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                     .
                     super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_false>
                     ._M_head_impl._callable.L);
      local_40.m_at = DT_REQUIRE;
      local_30 = pf->_line;
      doctest::detail::Expression_lhs<unsigned_long_const>::operator==
                (&local_d8,(Expression_lhs<unsigned_long_const> *)&local_40,&local_30);
      doctest::String::operator=(&local_b8.super_AssertData.m_decomp,&local_d8.m_decomp);
      local_b8.super_AssertData._40_2_ =
           CONCAT11(local_b8.super_AssertData.m_threw,local_d8.m_passed) ^ 1;
      dVar8 = extraout_XMM0_Qa_11;
      if ((local_d8.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_d8.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_d8.m_decomp.field_0.data.ptr);
        dVar8 = extraout_XMM0_Qa_12;
      }
      doctest::detail::ResultBuilder::log(&local_b8,dVar8);
      if (extraout_AL_05 != '\0') {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
      if (local_b8.super_AssertData.m_failed == true) {
        bVar6 = doctest::detail::checkIfShouldThrow(local_b8.super_AssertData.m_at);
        if (bVar6) {
          doctest::detail::throwException();
        }
      }
      if ((local_b8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                           local_b8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_decomp.field_0._1_7_,
                                           local_b8.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_b8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                           local_b8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_b8.super_AssertData.m_exception.field_0._1_7_,
                                           local_b8.super_AssertData.m_exception.field_0.buf[0]));
      }
      psVar4 = (this->_pipes).
               super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
               .
               super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_false>
               ._M_head_impl._callable.j1;
      sVar1 = *psVar4;
      (((this->_pipes).
        super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
        .
        super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_false>
        ._M_head_impl._callable.mybuffer)->
      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>)._M_impl.
      super__Vector_impl_data._M_start[pf->_line]._M_elems[pf->_pipe] =
           (((this->_pipes).
             super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
             .
             super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_false>
             ._M_head_impl._callable.source)->super__Vector_base<int,_std::allocator<int>_>)._M_impl
           .super__Vector_impl_data._M_start[sVar1] + 1;
      *psVar4 = sVar1 + 1;
    }
  }
  return;
}

Assistant:

void Pipeline<Ps...>::_on_pipe(Pipeflow& pf, Runtime& rt) {
  visit_tuple([&](auto&& pipe){
    using callable_t = typename std::decay_t<decltype(pipe)>::callable_t;
    if constexpr (std::is_invocable_v<callable_t, Pipeflow&>) {
      pipe._callable(pf);
    }
    else if constexpr(std::is_invocable_v<callable_t, Pipeflow&, Runtime&>) {
      pipe._callable(pf, rt);
    }
    else {
      static_assert(dependent_false_v<callable_t>, "un-supported pipe callable type");
    }
  }, _pipes, pf._pipe);
}